

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O1

bool aedit_type(CHAR_DATA *ch,char *argument)

{
  void *pvVar1;
  int iVar2;
  bool bVar3;
  char *txt;
  
  if (*argument == '\0') {
    txt = "Syntax:  type <type>\n\r";
  }
  else {
    pvVar1 = ch->desc->pEdit;
    iVar2 = flag_lookup(argument,area_type_table);
    if (iVar2 != -99) {
      *(short *)((long)pvVar1 + 0x5c) = (short)iVar2;
      bVar3 = true;
      txt = "Type set.\n\r";
      goto LAB_0036115a;
    }
    txt = "Not a valid type.\n\r";
  }
  bVar3 = false;
LAB_0036115a:
  send_to_char(txt,ch);
  return bVar3;
}

Assistant:

bool aedit_type(CHAR_DATA *ch, char *argument)
{
	AREA_DATA *pArea;
	int type = 0;

	EDIT_AREA(ch, pArea);

	if (!*argument)
	{
		send_to_char("Syntax:  type <type>\n\r", ch);
		return false;
	}

	type = flag_lookup(argument, area_type_table);
	if (type == NO_FLAG)
	{
		send_to_char("Not a valid type.\n\r", ch);
		return false;
	}

	pArea->area_type = type;
	send_to_char("Type set.\n\r", ch);

	return true;
}